

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O3

void wwShLo(word *a,size_t n,size_t shift)

{
  byte bVar1;
  ulong uVar2;
  word *pwVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  if (shift < n << 6) {
    uVar6 = shift >> 6;
    if ((shift & 0x3f) == 0) {
      uVar5 = n - uVar6;
      uVar2 = uVar5;
      pwVar3 = a;
      if (n < uVar6 || uVar5 == 0) {
        uVar5 = 0;
      }
      else {
        do {
          *pwVar3 = pwVar3[uVar6];
          uVar2 = uVar2 - 1;
          pwVar3 = pwVar3 + 1;
        } while (uVar2 != 0);
      }
    }
    else {
      if (uVar6 + 1 < n) {
        lVar4 = ~uVar6 + n;
        pwVar3 = a;
        do {
          bVar1 = (byte)shift & 0x3f;
          *pwVar3 = a[uVar6] >> bVar1 | a[uVar6 + 1] << 0x40 - bVar1;
          uVar6 = uVar6 + 1;
          pwVar3 = pwVar3 + 1;
        } while (n - 1 != uVar6);
      }
      else {
        lVar4 = 0;
      }
      a[lVar4] = a[uVar6] >> (sbyte)(shift & 0x3f);
      uVar5 = lVar4 + 1;
    }
    bVar7 = n < uVar5;
    n = n - uVar5;
    if (bVar7 || n == 0) {
      return;
    }
    a = a + uVar5;
  }
  else if (n == 0) {
    return;
  }
  memset(a,0,n << 3);
  return;
}

Assistant:

void wwShLo(word a[], size_t n, size_t shift)
{
	ASSERT(wwIsValid(a, n));
	if (shift < B_PER_W * n)
	{
		size_t wshift = shift / B_PER_W, pos;
		// величина сдвига не кратна длине слова?
		if (shift %= B_PER_W)
		{
			// сдвиг всех слов, кроме последнего
			for (pos = 0; pos + wshift + 1 < n; pos++)
				a[pos] = a[pos + wshift] >> shift |
					a[pos + wshift + 1] << (B_PER_W - shift);
			// последнее слово
			ASSERT(pos + wshift < n);
			a[pos] = a[pos + wshift] >> shift;
			++pos;
		}
		// величина сдвига кратна длине слова
		else for (pos = 0; pos + wshift < n; pos++)
			a[pos] = a[pos + wshift];
		// обнуление последних слов
		for (; pos < n; a[pos++] = 0);
	}
	else
		wwSetZero(a, n);
}